

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O1

void __thiscall acto::core::event::signaled(event *this)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 == 0) {
    this->triggered_ = true;
    std::condition_variable::notify_one();
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void event::signaled() {
  std::lock_guard g(mutex_);

  triggered_ = true;
  cond_.notify_one();
}